

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceClass
          (Generator *this,ServiceDescriptor *descriptor)

{
  io::Printer::Print(this->printer_,
                     "$class_name$ = service_reflection.GeneratedServiceType(\'$class_name$\', (_service.Service,), dict(\n"
                     ,"class_name",*(string **)descriptor);
  io::Printer::Indent(this->printer_);
  PrintDescriptorKeyAndModuleName(this,descriptor);
  io::Printer::Print(this->printer_,"))\n\n");
  io::Printer::Outdent(this->printer_);
  return;
}

Assistant:

void Generator::PrintServiceClass(const ServiceDescriptor& descriptor) const {
  // Print the service.
  printer_->Print("$class_name$ = service_reflection.GeneratedServiceType("
                  "'$class_name$', (_service.Service,), dict(\n",
                  "class_name", descriptor.name());
  printer_->Indent();
  Generator::PrintDescriptorKeyAndModuleName(descriptor);
  printer_->Print("))\n\n");
  printer_->Outdent();
}